

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceStub.cpp
# Opt level: O2

bool __thiscall irr::CIrrDeviceStub::checkVersion(CIrrDeviceStub *this,char *version)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double __x;
  stringc w;
  
  iVar1 = (*(this->super_IrrlichtDevice)._vptr_IrrlichtDevice[0x16])();
  iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),version);
  if (iVar1 != 0) {
    w.str._M_dataplus._M_p = (pointer)&w.str.field_2;
    w.str._M_string_length = 0;
    w.str.field_2._M_local_buf[0] = '\0';
    core::string<char>::operator=(&w,"Warning: The library version of the Irrlicht Engine (");
    iVar2 = (*(this->super_IrrlichtDevice)._vptr_IrrlichtDevice[0x16])(this);
    core::string<char>::operator+=(&w,(char *)CONCAT44(extraout_var_00,iVar2));
    core::string<char>::operator+=
              (&w,") does not match the version the application was compiled with (");
    core::string<char>::operator+=(&w,version);
    core::string<char>::operator+=(&w,"). This may cause problems.");
    os::Printer::log((Printer *)w.str._M_dataplus._M_p,__x);
    ::std::__cxx11::string::_M_dispose();
  }
  return iVar1 == 0;
}

Assistant:

bool CIrrDeviceStub::checkVersion(const char *version)
{
	if (strcmp(getVersion(), version)) {
		core::stringc w;
		w = "Warning: The library version of the Irrlicht Engine (";
		w += getVersion();
		w += ") does not match the version the application was compiled with (";
		w += version;
		w += "). This may cause problems.";
		os::Printer::log(w.c_str(), ELL_WARNING);

		return false;
	}

	return true;
}